

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Sine.cpp
# Opt level: O2

void __thiscall chrono::ChFunction_Sine::ArchiveIN(ChFunction_Sine *this,ChArchiveIn *marchive)

{
  ChNameValue<double> local_60;
  ChNameValue<double> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChFunction_Sine>(marchive);
  ChFunction::ArchiveIN(&this->super_ChFunction,marchive);
  local_30._value = &this->amp;
  local_30._name = "amp";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->phase;
  local_48._name = "phase";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->freq;
  local_60._name = "freq";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  return;
}

Assistant:

void ChFunction_Sine::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunction_Sine>();
    // deserialize parent class
    ChFunction::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(amp);
    marchive >> CHNVP(phase);
    marchive >> CHNVP(freq);
}